

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
          (SourceTreeDescriptorDatabase *this,SourceTree *source_tree,
          DescriptorDatabase *fallback_database)

{
  DescriptorDatabase *in_RDX;
  SourceTree *in_RSI;
  SourceTreeDescriptorDatabase *in_RDI;
  ValidationErrorCollector *this_00;
  
  DescriptorDatabase::DescriptorDatabase(&in_RDI->super_DescriptorDatabase);
  (in_RDI->super_DescriptorDatabase)._vptr_DescriptorDatabase =
       (_func_int **)&PTR__SourceTreeDescriptorDatabase_00899208;
  in_RDI->source_tree_ = in_RSI;
  in_RDI->fallback_database_ = in_RDX;
  in_RDI->error_collector_ = (MultiFileErrorCollector *)0x0;
  in_RDI->using_validation_error_collector_ = false;
  this_00 = (ValidationErrorCollector *)&in_RDI->source_locations_;
  SourceLocationTable::SourceLocationTable((SourceLocationTable *)this_00);
  ValidationErrorCollector::ValidationErrorCollector(this_00,in_RDI);
  return;
}

Assistant:

SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase(
    SourceTree* source_tree, DescriptorDatabase* fallback_database)
    : source_tree_(source_tree),
      fallback_database_(fallback_database),
      error_collector_(nullptr),
      using_validation_error_collector_(false),
      validation_error_collector_(this) {}